

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImStb::STB_TEXTEDIT_LAYOUTROW(StbTexteditRow *r,ImGuiInputTextState *obj,int line_start_idx)

{
  undefined8 uVar1;
  long lVar2;
  int in_EDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined1 auVar3 [64];
  ImVec2 *unaff_retaddr;
  ImVec2 size;
  ImWchar *text_remaining;
  ImWchar *text;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined1 extraout_var [56];
  
  lVar2 = *(long *)(in_RSI + 0x18);
  auVar3._0_8_ = InputTextCalcTextSizeW
                           (text,text_remaining,(ImWchar **)size,unaff_retaddr,
                            SUB81((ulong)in_RDI >> 0x38,0));
  auVar3._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  *in_RDI = 0;
  local_30 = (undefined4)uVar1;
  in_RDI[1] = local_30;
  uStack_2c = (undefined4)((ulong)uVar1 >> 0x20);
  in_RDI[2] = uStack_2c;
  in_RDI[3] = 0;
  in_RDI[4] = uStack_2c;
  in_RDI[5] = (int)(-(lVar2 + (long)in_EDX * 2) >> 1);
  return;
}

Assistant:

static void    STB_TEXTEDIT_LAYOUTROW(StbTexteditRow* r, STB_TEXTEDIT_STRING* obj, int line_start_idx)
{
    const ImWchar* text = obj->TextW.Data;
    const ImWchar* text_remaining = NULL;
    const ImVec2 size = InputTextCalcTextSizeW(text + line_start_idx, text + obj->CurLenW, &text_remaining, NULL, true);
    r->x0 = 0.0f;
    r->x1 = size.x;
    r->baseline_y_delta = size.y;
    r->ymin = 0.0f;
    r->ymax = size.y;
    r->num_chars = (int)(text_remaining - (text + line_start_idx));
}